

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction * __thiscall
pbrt::Sphere::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Sphere *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  bool bVar1;
  Transform *this_00;
  Transform *pTVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  bool bVar8;
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  Vector3f dpdu;
  Vector3f wo_00;
  Vector3f dpdv;
  Point3f pHit;
  Point3f local_220;
  float local_214;
  float local_210;
  float local_20c;
  uint local_208;
  uint uStack_204;
  uint local_200;
  float fStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint local_1f0;
  Float FStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  float local_1b0;
  undefined4 local_1a8;
  float fStack_1a4;
  float local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  Tuple3<pbrt::Vector3,_float> local_148;
  Point3fi local_138;
  SurfaceInteraction local_120;
  
  local_220.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  local_220.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_220.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  local_1d8 = *(undefined1 (*) [16])&this->phiMax;
  fVar24 = local_220.super_Tuple3<pbrt::Point3,_float>.z / this->radius;
  auVar21 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar24));
  local_1c8._0_4_ = fVar24;
  uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar24),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar8 = (bool)((byte)uVar7 & 1);
  local_198 = ZEXT416((uint)isect->phi);
  FStack_1ec = time;
  fVar24 = acosf((float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar21._0_4_));
  fVar24 = fVar24 - this->thetaZMin;
  fVar19 = this->thetaZMax - this->thetaZMin;
  local_1e8 = ZEXT416((uint)fVar19);
  auVar21._0_4_ =
       local_220.super_Tuple3<pbrt::Point3,_float>.x * local_220.super_Tuple3<pbrt::Point3,_float>.x
  ;
  auVar21._4_4_ =
       local_220.super_Tuple3<pbrt::Point3,_float>.y * local_220.super_Tuple3<pbrt::Point3,_float>.y
  ;
  auVar21._8_8_ = 0;
  auVar21 = vhaddps_avx(auVar21,auVar21);
  if (auVar21._0_4_ < 0.0) {
    local_158 = ZEXT416((uint)fVar24);
    local_1e8 = ZEXT416((uint)fVar19);
    fVar19 = sqrtf(auVar21._0_4_);
    auVar21 = local_158;
  }
  else {
    auVar21 = vsqrtss_avx(auVar21,auVar21);
    fVar19 = auVar21._0_4_;
    auVar21 = ZEXT416((uint)fVar24);
  }
  auVar21 = vinsertps_avx(local_198,auVar21,0x10);
  local_198 = vinsertps_avx(local_1d8,local_1e8,0x10);
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)this->phiMax),auVar16);
  auVar16 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_1c8._0_4_ * (float)local_1c8._0_4_)),
                       ZEXT816(0) << 0x40);
  auVar18._8_8_ = 0;
  auVar18._0_4_ = local_220.super_Tuple3<pbrt::Point3,_float>.x;
  auVar18._4_4_ = local_220.super_Tuple3<pbrt::Point3,_float>.y;
  auVar22._4_4_ = fVar19;
  auVar22._0_4_ = fVar19;
  auVar22._8_4_ = fVar19;
  auVar22._12_4_ = fVar19;
  local_1c8 = vdivps_avx(auVar18,auVar22);
  auVar22 = vmovshdup_avx(auVar18);
  fVar24 = auVar22._0_4_ * auVar9._0_4_;
  auVar28 = ZEXT464((uint)fVar24);
  fVar19 = local_220.super_Tuple3<pbrt::Point3,_float>.x * this->phiMax;
  auVar31 = ZEXT464((uint)fVar19);
  local_1e8 = ZEXT416((uint)fVar24);
  local_188 = ZEXT416((uint)fVar19);
  if (auVar16._0_4_ < 0.0) {
    local_1d8 = auVar21;
    fVar24 = sqrtf(auVar16._0_4_);
    auVar31 = ZEXT1664(local_188);
    auVar28 = ZEXT1664(local_1e8);
    auVar21 = local_1d8;
  }
  else {
    auVar16 = vsqrtss_avx(auVar16,auVar16);
    fVar24 = auVar16._0_4_;
  }
  local_158 = vdivps_avx(auVar21,local_198);
  auVar27 = auVar28._0_16_;
  auVar30 = auVar31._0_16_;
  local_198 = vinsertps_avx(auVar27,auVar30,0x10);
  fVar6 = this->thetaZMax - this->thetaZMin;
  auVar23._8_4_ = 0x80000000;
  auVar23._0_8_ = 0x8000000080000000;
  auVar23._12_4_ = 0x80000000;
  auVar25._0_4_ = fVar6 * local_1c8._0_4_ * local_220.super_Tuple3<pbrt::Point3,_float>.z;
  auVar25._4_4_ = fVar6 * local_1c8._4_4_ * local_220.super_Tuple3<pbrt::Point3,_float>.z;
  auVar25._8_4_ = fVar6 * local_1c8._8_4_ * local_220.super_Tuple3<pbrt::Point3,_float>.z;
  auVar25._12_4_ = fVar6 * local_1c8._12_4_ * local_220.super_Tuple3<pbrt::Point3,_float>.z;
  auVar21 = vmovshdup_avx(auVar25);
  fVar4 = fVar6 * fVar24 * -this->radius;
  fVar24 = this->phiMax;
  fVar19 = fVar24 * -fVar24;
  auVar10 = vmulss_avx512f(ZEXT416((uint)local_220.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)fVar19));
  auVar11 = vmulss_avx512f(ZEXT416((uint)fVar19),
                           ZEXT416((uint)local_220.super_Tuple3<pbrt::Point3,_float>.y));
  auVar32 = ZEXT816(0) << 0x40;
  auVar12 = vmulss_avx512f(ZEXT416((uint)fVar19),auVar32);
  fVar24 = fVar6 * local_220.super_Tuple3<pbrt::Point3,_float>.z * fVar24;
  auVar16 = vmovshdup_avx(local_1c8);
  auVar9._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
  auVar9._8_4_ = auVar16._8_4_ ^ 0x80000000;
  auVar9._12_4_ = auVar16._12_4_ ^ 0x80000000;
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar24),auVar9);
  auVar14 = vmulss_avx512f(local_1c8,ZEXT416((uint)fVar24));
  fVar6 = fVar6 * -fVar6;
  auVar15 = vmulss_avx512f(ZEXT416((uint)fVar6),
                           ZEXT416((uint)local_220.super_Tuple3<pbrt::Point3,_float>.y));
  fVar5 = local_220.super_Tuple3<pbrt::Point3,_float>.z * fVar6;
  fVar29 = auVar31._0_4_;
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),auVar27,auVar27);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * auVar21._0_4_)),auVar27,auVar25);
  auVar9 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar4),auVar32);
  auVar16 = vmulss_avx512f(auVar21,auVar21);
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar25,auVar25);
  auVar26 = ZEXT416((uint)fVar4);
  auVar17 = vfmadd231ss_avx512f(auVar16,ZEXT416((uint)fVar4),auVar26);
  auVar16 = ZEXT416((uint)(auVar21._0_4_ * 0.0));
  auVar18 = vfmsub213ss_fma(auVar26,auVar30,auVar16);
  auVar16 = vfmadd213ss_fma(auVar23,auVar21,auVar16);
  fVar19 = auVar18._0_4_ + auVar16._0_4_;
  auVar18 = ZEXT416((uint)(auVar28._0_4_ * fVar4));
  auVar16 = vfmsub213ss_fma(ZEXT816(0) << 0x20,auVar25,auVar18);
  local_1d8._0_4_ = fVar4;
  auVar18 = vfnmadd231ss_fma(auVar18,auVar27,auVar26);
  fVar4 = auVar16._0_4_ + auVar18._0_4_;
  auVar16 = vfmsub213ss_fma(auVar21,auVar27,ZEXT416((uint)(fVar29 * auVar25._0_4_)));
  auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar29 * auVar25._0_4_)),auVar30,auVar25);
  fVar29 = auVar16._0_4_ + auVar18._0_4_;
  fVar3 = fVar29 * fVar29 + fVar19 * fVar19 + fVar4 * fVar4;
  local_1c8 = auVar25;
  if (fVar3 < 0.0) {
    local_178._0_4_ = auVar9._0_4_;
    local_1f0 = auVar17._0_4_;
    uStack_1f4 = auVar10._0_4_;
    local_1f8 = auVar13._0_4_;
    local_200 = auVar11._0_4_;
    uStack_204 = auVar14._0_4_;
    local_208 = auVar15._0_4_;
    local_214 = fVar29;
    local_210 = fVar4;
    local_20c = fVar19;
    fStack_1fc = fVar6 * local_220.super_Tuple3<pbrt::Point3,_float>.x;
    local_168 = auVar21;
    fVar20 = sqrtf(fVar3);
    auVar15 = ZEXT416(local_208);
    auVar14 = ZEXT416(uStack_204);
    auVar11 = ZEXT416(local_200);
    auVar13 = ZEXT416(local_1f8);
    auVar10 = ZEXT416(uStack_1f4);
    auVar17 = ZEXT416(local_1f0);
    auVar12 = ZEXT416(auVar12._0_4_);
    auVar9 = ZEXT416((uint)local_178._0_4_);
    auVar22 = ZEXT416(auVar22._0_4_);
    auVar32 = ZEXT816(0) << 0x40;
    auVar31 = ZEXT1664(local_188);
    auVar28 = ZEXT1664(local_1e8);
    fVar19 = local_20c;
    fVar4 = local_210;
    fVar3 = fStack_1fc;
    fVar29 = local_214;
    auVar21 = local_168;
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    fVar20 = auVar16._0_4_;
    fVar3 = fVar6 * local_220.super_Tuple3<pbrt::Point3,_float>.x;
  }
  auVar23 = ZEXT416((uint)(fVar19 / fVar20));
  auVar25 = ZEXT416((uint)(fVar4 / fVar20));
  auVar18 = ZEXT416((uint)(fVar29 / fVar20));
  auVar16 = vmulss_avx512f(auVar11,auVar25);
  auVar16 = vfmadd213ss_avx512f(auVar10,auVar23,auVar16);
  auVar11 = vfmadd213ss_avx512f(auVar12,auVar18,auVar16);
  auVar16 = vmulss_avx512f(auVar14,auVar25);
  auVar16 = vfmadd213ss_avx512f(auVar13,auVar23,auVar16);
  auVar12 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar24 * 0.0)),auVar18,auVar16);
  auVar16 = vmulss_avx512f(auVar15,auVar25);
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar23,auVar16);
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar18,auVar16);
  auVar10 = ZEXT416((uint)(auVar9._0_4_ * auVar9._0_4_));
  auVar18 = vfmsub213ss_fma(auVar17,auVar22,auVar10);
  auVar10 = vfnmadd231ss_fma(auVar10,auVar9,auVar9);
  fVar24 = auVar18._0_4_ + auVar10._0_4_;
  uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar24),auVar32,0);
  fVar4 = (float)((uint)!(bool)((byte)uVar7 & 1) * (int)(1.0 / fVar24));
  auVar18 = vmulss_avx512f(auVar17,auVar11);
  auVar18 = vfmsub231ss_fma(auVar18,auVar12,auVar9);
  fVar24 = fVar4 * auVar18._0_4_;
  auVar18 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar12._0_4_ * auVar22._0_4_)),auVar9,auVar11);
  fVar19 = fVar4 * auVar18._0_4_;
  local_168._0_4_ = auVar28._0_4_ * fVar24 + (float)local_1c8._0_4_ * fVar19;
  fVar29 = auVar31._0_4_ * fVar24 + auVar21._0_4_ * fVar19;
  fVar3 = fVar24 * 0.0 + (float)local_1d8._0_4_ * fVar19;
  auVar18 = vmulss_avx512f(auVar17,auVar12);
  auVar18 = vfmsub231ss_fma(auVar18,auVar16,auVar9);
  fVar24 = fVar4 * auVar18._0_4_;
  auVar16 = vfmsub231ss_fma(ZEXT416((uint)(auVar22._0_4_ * auVar16._0_4_)),auVar9,auVar12);
  fVar4 = fVar4 * auVar16._0_4_;
  local_1e8._0_4_ = auVar28._0_4_ * fVar24 + (float)local_1c8._0_4_ * fVar4;
  local_188._0_4_ = auVar31._0_4_ * fVar24 + auVar21._0_4_ * fVar4;
  fVar6 = fVar24 * 0.0 + (float)local_1d8._0_4_ * fVar4;
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx(ZEXT416((uint)local_220.super_Tuple3<pbrt::Point3,_float>.z),auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_4_ = local_220.super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = local_220.super_Tuple3<pbrt::Point3,_float>.y;
  auVar16 = vandps_avx(auVar12,auVar11);
  auVar10._8_4_ = 0x34a00003;
  auVar10._0_8_ = 0x34a0000334a00003;
  auVar10._12_4_ = 0x34a00003;
  auVar16 = vmulps_avx512vl(auVar16,auVar10);
  local_148.z = auVar21._0_4_ * 2.980233e-07;
  local_148._0_8_ = vmovlps_avx(auVar16);
  bVar8 = this->reverseOrientation;
  bVar1 = this->transformSwapsHandedness;
  this_00 = this->renderFromObject;
  pTVar2 = this->objectFromRender;
  fVar24 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar19 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar4 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * (pTVar2->m).m[0][1])),ZEXT416((uint)fVar24),
                            ZEXT416((uint)(pTVar2->m).m[0][0]));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar2->m).m[0][2]));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * (pTVar2->m).m[1][1])),ZEXT416((uint)fVar24),
                            ZEXT416((uint)(pTVar2->m).m[1][0]));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar2->m).m[1][2]));
  local_178 = vinsertps_avx(auVar21,auVar16,0x10);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * (pTVar2->m).m[2][1])),ZEXT416((uint)fVar24),
                            ZEXT416((uint)(pTVar2->m).m[2][0]));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar2->m).m[2][2]));
  Point3fi::Point3fi(&local_138,&local_220,(Vector3f *)&local_148);
  auVar9 = local_178;
  auVar22 = local_198;
  auVar16 = local_1c8;
  local_1a8 = local_168._0_4_;
  local_1b8 = local_1e8._0_4_;
  uStack_1b4 = local_188._0_4_;
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_188._0_4_;
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_1e8._0_4_;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = fVar29;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_168._0_4_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = fVar3;
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = fVar6;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_198._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_178._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_178._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1d8._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1c8._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1c8._4_4_;
  local_1c8 = auVar16;
  local_1b0 = fVar6;
  fStack_1a4 = fVar29;
  local_1a0 = fVar3;
  local_198 = auVar22;
  local_178 = auVar9;
  SurfaceInteraction::SurfaceInteraction
            (&local_120,pi,(Point2f)local_158._0_8_,wo_00,dpdu,dpdv,dndu,dndv,FStack_1ec,
             bVar8 != bVar1);
  Transform::operator()(__return_storage_ptr__,this_00,&local_120);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of sphere hit
        Float u = phi / phiMax;
        Float cosTheta = pHit.z / radius;
        Float theta = SafeACos(cosTheta);
        Float v = (theta - thetaZMin) / (thetaZMax - thetaZMin);
        // Compute sphere $\dpdu$ and $\dpdv$
        Float zRadius = std::sqrt(Sqr(pHit.x) + Sqr(pHit.y));
        Float cosPhi = pHit.x / zRadius;
        Float sinPhi = pHit.y / zRadius;
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
        Vector3f dpdv = (thetaZMax - thetaZMin) *
                        Vector3f(pHit.z * cosPhi, pHit.z * sinPhi, -radius * sinTheta);

        // Compute sphere $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv =
            (thetaZMax - thetaZMin) * pHit.z * phiMax * Vector3f(-sinPhi, cosPhi, 0.);
        Vector3f d2Pdvv = -Sqr(thetaZMax - thetaZMin) * Vector3f(pHit.x, pHit.y, pHit.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for sphere intersection
        Vector3f pError = gamma(5) * Abs((Vector3f)pHit);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }